

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc_data.cpp
# Opt level: O3

void __thiscall NPC_Data::~NPC_Data(NPC_Data *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  NPC_Citizenship *__ptr;
  pointer pcVar2;
  
  __ptr = (this->citizenship)._M_t.
          super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>._M_t.
          super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
          super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl;
  if (__ptr != (NPC_Citizenship *)0x0) {
    std::default_delete<NPC_Citizenship>::operator()
              ((default_delete<NPC_Citizenship> *)&this->citizenship,__ptr);
  }
  (this->citizenship)._M_t.
  super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>._M_t.
  super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
  super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl = (NPC_Citizenship *)0x0;
  std::
  vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  ::~vector(&this->skill_learn);
  std::
  vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
  ::~vector(&this->shop_craft);
  std::
  vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
  ::~vector(&this->shop_trade);
  pcVar2 = (this->skill_name)._M_dataplus._M_p;
  paVar1 = &(this->skill_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->shop_name)._M_dataplus._M_p;
  paVar1 = &(this->shop_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  ::~vector(&this->drops);
  return;
}

Assistant:

NPC_Data::~NPC_Data()
{

}